

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O2

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::MultAddMT
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  double dVar4;
  long lVar5;
  bool bVar6;
  complex<double> *pcVar7;
  long *plVar8;
  size_t sVar9;
  TPZFMatrix<std::complex<double>_> *pTVar10;
  TPZFMatrix<std::complex<double>_> *pTVar11;
  undefined8 uVar12;
  char *pcVar13;
  TPZFMatrix<std::complex<double>_> *pTVar14;
  int iVar15;
  int64_t iVar16;
  long lVar17;
  complex<double> *__x;
  TPZFMatrix<std::complex<double>_> *pTVar18;
  long lVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  TPZFMatrix<std::complex<double>_> *in_XMM1_Qa;
  double in_XMM1_Qb;
  TPZFMatrix<std::complex<double>_> *in_XMM2_Qa;
  TPZFMatrix<std::complex<double>_> *in_XMM3_Qa;
  complex<double> a;
  complex<double> aval;
  undefined1 local_c8 [16];
  TPZFMatrix<std::complex<double>_> *local_b8;
  double dStack_b0;
  undefined8 local_a8;
  double dStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  TPZFMatrix<std::complex<double>_> *local_70;
  complex<double> local_68;
  undefined1 local_58 [16];
  complex<double> local_48;
  
  iVar15 = alpha._M_value._0_4_;
  pTVar14 = (TPZFMatrix<std::complex<double>_> *)
            (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  local_b8 = y;
  if (((pTVar14 ==
        (TPZFMatrix<std::complex<double>_> *)
        (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) &&
      (pTVar14 ==
       (TPZFMatrix<std::complex<double>_> *)
       (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) &&
     ((y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow ==
      (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
    local_c8 = ZEXT816(0);
    lVar19 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
    iVar16 = lVar19;
    if (iVar15 != 0) {
      iVar16 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    }
    pTVar10 = (TPZFMatrix<std::complex<double>_> *)0x0;
    local_a8 = pTVar14;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    pTVar18 = (TPZFMatrix<std::complex<double>_> *)0x0;
    if (0 < (long)pTVar14) {
      pTVar18 = pTVar14;
    }
    for (; pTVar10 != pTVar18;
        pTVar10 = (TPZFMatrix<std::complex<double>_> *)
                  ((long)&(pTVar10->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                          super_TPZSavable._vptr_TPZSavable + 1)) {
      uVar12 = 0;
      pTVar14 = z;
      pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(z,0,(int64_t)pTVar10);
      in_XMM1_Qb = 0.0;
      a._M_value._8_8_ = uVar12;
      a._M_value._0_8_ = pTVar14;
      in_XMM1_Qa = local_88;
      bVar6 = IsZero(a);
      if (bVar6) {
        pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(z,0,0);
        for (sVar9 = 0; iVar16 * 0x10 != sVar9; sVar9 = sVar9 + 0x10) {
          *(undefined8 *)(pcVar7->_M_value + sVar9) = 0;
          *(undefined8 *)((long)(pcVar7->_M_value + sVar9) + 8) = 0;
        }
      }
      else if (z != local_b8) {
        memcpy(pcVar7,local_b8->fElem,iVar16 * 0x10);
      }
    }
    local_70 = z;
    if (iVar15 == 0 && local_a8 == (TPZFMatrix<std::complex<double>_> *)0x1) {
      if (((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol !=
           (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) ||
         ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow !=
          (local_b8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
        pcVar13 = 
        "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=false\n";
        goto LAB_00dcdcb3;
      }
      local_98 = (TPZFMatrix<std::complex<double>_> *)0x0;
      if (lVar19 < 1) {
        lVar19 = (long)local_98;
      }
      while (local_98 != (TPZFMatrix<std::complex<double>_> *)lVar19) {
        plVar8 = (this->fIA).fStore;
        plVar2 = (this->fJA).fStore;
        lVar17 = plVar8[(long)local_98];
        lVar3 = plVar8[(long)local_98 + 1];
        pcVar7 = x->fElem;
        __x = (this->fA).fStore + lVar17;
        local_c8 = ZEXT816(0);
        lVar5 = (long)local_98 + 1;
        local_88 = local_98;
        for (; local_98 = (TPZFMatrix<std::complex<double>_> *)lVar5, lVar17 < lVar3;
            lVar17 = lVar17 + 1) {
          std::operator*(__x,pcVar7 + plVar2[lVar17]);
          dVar4 = (double)in_XMM1_Qa + (double)local_c8._8_8_;
          local_c8._8_4_ = SUB84(dVar4,0);
          local_c8._0_8_ =
               (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) + (double)local_c8._0_8_;
          local_c8._12_4_ = (int)((ulong)dVar4 >> 0x20);
          __x = __x + 1;
          lVar5 = (long)local_98;
        }
        std::operator*(&local_68,(complex<double> *)local_c8);
        local_a8 = (TPZFMatrix<std::complex<double>_> *)
                   CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        local_b8 = in_XMM1_Qa;
        dStack_b0 = in_XMM1_Qb;
        pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(local_70,(int64_t)local_88,0);
        in_XMM1_Qa = (TPZFMatrix<std::complex<double>_> *)
                     ((double)local_a8 + *(double *)pcVar7->_M_value);
        in_XMM1_Qb = (double)local_b8 + *(double *)(pcVar7->_M_value + 8);
        *(TPZFMatrix<std::complex<double>_> **)pcVar7->_M_value = in_XMM1_Qa;
        *(double *)(pcVar7->_M_value + 8) = in_XMM1_Qb;
      }
    }
    else {
      for (pTVar14 = (TPZFMatrix<std::complex<double>_> *)0x0; pTVar14 != pTVar18;
          pTVar14 = (TPZFMatrix<std::complex<double>_> *)
                    ((long)&(pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                            super_TPZSavable._vptr_TPZSavable + 1)) {
        if (iVar15 == 0) {
          pTVar10 = (TPZFMatrix<std::complex<double>_> *)0x0;
          while ((long)pTVar10 <
                 (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) {
            local_c8 = ZEXT816(0);
            plVar8 = (this->fIA).fStore;
            lVar19 = plVar8[(long)pTVar10];
            pTVar11 = (TPZFMatrix<std::complex<double>_> *)
                      ((long)&(pTVar10->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                              super_TPZSavable._vptr_TPZSavable + 1);
            lVar17 = lVar19 << 4;
            local_88 = pTVar10;
            for (; lVar19 < plVar8[(long)pTVar11]; lVar19 = lVar19 + 1) {
              std::operator*((complex<double> *)(((this->fA).fStore)->_M_value + lVar17),
                             x->fElem +
                             (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                             (long)pTVar14 + (this->fJA).fStore[lVar19]);
              dVar4 = (double)in_XMM1_Qa + (double)local_c8._8_8_;
              local_c8._8_4_ = SUB84(dVar4,0);
              local_c8._0_8_ =
                   (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02) +
                   (double)local_c8._0_8_;
              local_c8._12_4_ = (int)((ulong)dVar4 >> 0x20);
              plVar8 = (this->fIA).fStore;
              lVar17 = lVar17 + 0x10;
            }
            std::operator*(&local_68,(complex<double> *)local_c8);
            local_98 = (TPZFMatrix<std::complex<double>_> *)
                       CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
            uStack_90 = (double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
            local_a8 = in_XMM1_Qa;
            dStack_a0 = in_XMM1_Qb;
            pcVar7 = TPZFMatrix<std::complex<double>_>::operator()
                               (local_70,(int64_t)local_88,(int64_t)pTVar14);
            in_XMM1_Qa = (TPZFMatrix<std::complex<double>_> *)
                         ((double)local_98 + SUB168(*(undefined1 (*) [16])pcVar7->_M_value,0));
            in_XMM1_Qb = (double)local_a8 + SUB168(*(undefined1 (*) [16])pcVar7->_M_value,8);
            *(TPZFMatrix<std::complex<double>_> **)pcVar7->_M_value = in_XMM1_Qa;
            *(double *)(pcVar7->_M_value + 8) = in_XMM1_Qb;
            pTVar10 = pTVar11;
          }
        }
        else {
          lVar19 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          if ((lVar19 != (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) ||
             ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol !=
              (local_b8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
            std::operator<<((ostream *)&std::cout,
                            "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=true\n"
                           );
            return;
          }
          pTVar10 = (TPZFMatrix<std::complex<double>_> *)0x0;
          while ((long)pTVar10 < lVar19) {
            plVar8 = (this->fIA).fStore;
            lVar19 = plVar8[(long)pTVar10];
            pTVar11 = (TPZFMatrix<std::complex<double>_> *)
                      ((long)&(pTVar10->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                              super_TPZSavable._vptr_TPZSavable + 1);
            lVar17 = lVar19 << 4;
            local_a8 = pTVar10;
            for (; (lVar19 < plVar8[(long)pTVar11] &&
                   (lVar3 = (this->fJA).fStore[lVar19], lVar3 != -1)); lVar19 = lVar19 + 1) {
              puVar1 = (undefined8 *)(((this->fA).fStore)->_M_value + lVar17);
              local_48._M_value._0_8_ = *puVar1;
              local_48._M_value._8_8_ = puVar1[1];
              std::operator*(&local_68,&local_48);
              local_58._8_8_ = in_XMM1_Qa;
              std::operator*((complex<double> *)local_58,
                             x->fElem +
                             (long)&((TPZFMatrix<std::complex<double>_> *)
                                    (&((TPZFMatrix<std::complex<double>_> *)
                                      (&((TPZFMatrix<std::complex<double>_> *)
                                        (&local_a8->fPivot + -1))->fPivot + -1))->fPivot + -1))->
                                    fPivot +
                             (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                             (long)pTVar14 + 0xffffffffffffffc8U);
              local_88 = (TPZFMatrix<std::complex<double>_> *)
                         CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
              local_98 = in_XMM1_Qa;
              uStack_90 = in_XMM1_Qb;
              pcVar7 = TPZFMatrix<std::complex<double>_>::operator()
                                 (local_70,lVar3,(int64_t)pTVar14);
              in_XMM1_Qa = (TPZFMatrix<std::complex<double>_> *)
                           ((double)local_88 + SUB168(*(undefined1 (*) [16])pcVar7->_M_value,0));
              in_XMM1_Qb = (double)local_98 + SUB168(*(undefined1 (*) [16])pcVar7->_M_value,8);
              *(TPZFMatrix<std::complex<double>_> **)pcVar7->_M_value = in_XMM1_Qa;
              *(double *)(pcVar7->_M_value + 8) = in_XMM1_Qb;
              plVar8 = (this->fIA).fStore;
              lVar17 = lVar17 + 0x10;
            }
            pTVar10 = pTVar11;
            lVar19 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          }
        }
      }
    }
    return;
  }
  pcVar13 = "\nERROR! in TPZVerySparseMatrix::MultiplyAdd : incompatible dimensions in x, y or z\n";
LAB_00dcdcb3:
  std::operator<<((ostream *)&std::cout,pcVar13);
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::MultAddMT(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y,
									 TPZFMatrix<TVar> &z,
									 const TVar alpha,const TVar beta,const int opt )  {
	// computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot share storage
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || y.Rows() != z.Rows() )
	{
		cout << "\nERROR! in TPZVerySparseMatrix::MultiplyAdd : incompatible dimensions in x, y or z\n";
		return;
	}
	
	int64_t  ir, ic, icol, xcols;
	xcols = x.Cols();
	TVar sum;
	int64_t  r = (opt) ? this->Cols() : this->Rows();
	
	// Determine how to initialize z
	for(ic=0; ic<xcols; ic++) {
		TVar *zp = &(z(0,ic));
		if(!IsZero(beta)){
			const TVar *yp = &(y.g(0,0));
			TVar *zlast = zp+r;

            if(&z != &y) {
				memcpy(zp,yp,r*sizeof(TVar));
			}
		} else {
			TVar *zp = &(z(0,0)), *zlast = zp+r;
			while(zp != zlast) {
				*zp = 0.;
				zp ++;
			}
		}
	}
	// Compute alpha * A * x
	if(xcols == 1 && opt == 0)
	{
		if(this->Cols() != x.Rows() || this->Rows() != y.Rows())
		{
			cout << "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=false\n";
			return;
		} 
		for(ir=0; ir<r; ir++) {
			int64_t icolmin = fIA[ir];
			int64_t icolmax = fIA[ir+1];
			const TVar *xptr = &(x.g(0,0));
			TVar *Aptr = &fA[0];
			int64_t *JAptr = &fJA[0];
			for(sum = 0.0, icol=icolmin; icol<icolmax; icol++ ) {
				sum += Aptr[icol] * xptr[JAptr[icol]];
			}
			z(ir,0) += alpha * sum;
		}
	}
	else 
	{
		for(ic=0; ic<xcols; ic++) {
			if(opt == 0) {
				
				for(ir=0; ir<this->Rows(); ir++) {
					for(sum = 0.0, icol=fIA[ir]; icol<fIA[ir+1]; icol++ ) {
						sum += fA[icol] * x.g((fJA[icol]),ic);
					}
					z(ir,ic) += alpha * sum;
				}
			}
			
			// Compute alpha * A^T * x
			else 
			{
				if (this->Rows() != x.Rows() || this->Cols() != y.Rows())
				{
					cout << "\nERROR! in TPZFYsmpMatrix::MultiplyAddMT: incompatible dimensions in opt=true\n";
					return; 
				}
				int64_t jc;
				int64_t icol;
				for(ir=0; ir<this->Rows(); ir++) {
					for(icol=fIA[ir]; icol<fIA[ir+1]; icol++ ) {
						if(fJA[icol]==-1) break; //Checa a exist�cia de dado ou n�
						jc = fJA[icol];
						TVar aval = fA[icol];
						//cout << "FA["<<icol<<"] = "<<aval<< " * x["<< ir<<"] ="<< x.Get(ir,ic)<< endl;
						z(jc,ic) += alpha * aval * x.g(ir,ic);
					}
				}
			}
		}
	}
}